

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_tests.cpp
# Opt level: O3

void __thiscall skiplist_tests::skiplist_test::test_method(skiplist_test *this)

{
  CBlockIndex **ppCVar1;
  uint uVar2;
  CBlockIndex *__s;
  long lVar3;
  CBlockIndex *this_00;
  uint64_t uVar4;
  uint64_t uVar5;
  CBlockIndex *pCVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  int i;
  uint height;
  long lVar9;
  CBlockIndex *this_01;
  FastRandomContext *this_02;
  int i_1;
  int iVar10;
  CBlockIndex **ppCVar11;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  char **local_78;
  assertion_result local_70;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __s = (CBlockIndex *)operator_new(45600000);
  iVar10 = 0;
  memset(__s,0,45600000);
  lVar9 = 0;
  do {
    *(int *)((long)(__s->nChainWork).super_base_uint<256U>.pn + lVar9 + -0x10) = iVar10;
    lVar3 = (long)__s[-1].nChainWork.super_base_uint<256U>.pn + lVar9 + -0x28;
    if (lVar9 == 0) {
      lVar3 = 0;
    }
    *(long *)((long)(&__s->nChainWork + -1) + lVar9) = lVar3;
    CBlockIndex::BuildSkip
              ((CBlockIndex *)((long)(__s->nChainWork).super_base_uint<256U>.pn + lVar9 + -0x28));
    lVar9 = lVar9 + 0x98;
    iVar10 = iVar10 + 1;
  } while (lVar9 != 45600000);
  ppCVar1 = &__s->pskip;
  lVar9 = 0;
  ppCVar11 = ppCVar1;
  do {
    if (lVar9 == 0) {
      local_f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_e8 = "";
      local_100 = &boost::unit_test::basic_cstring<char_const>::null;
      local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x20;
      file_01.m_begin = (iterator)&local_f0;
      msg_01.m_end = in_R9;
      msg_01.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_100,
                 msg_01);
      local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(*ppCVar1 == (CBlockIndex *)0x0);
      local_70.m_message.px = (element_type *)0x0;
      local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_a0 = "vIndex[i].pskip == nullptr";
      local_98 = "";
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_78 = &local_a0;
      local_110 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_108 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_70,&local_90,1,0,WARN,(check_type)__s,(size_t)&local_110,0x20);
    }
    else {
      local_48 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_40 = "";
      local_58 = &boost::unit_test::basic_cstring<char_const>::null;
      local_50 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x1d;
      file.m_begin = (iterator)&local_48;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
      local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(*ppCVar11 == __s + (*ppCVar11)->nHeight);
      local_70.m_message.px = (element_type *)0x0;
      local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_a0 = "vIndex[i].pskip == &vIndex[vIndex[i].pskip->nHeight]";
      local_98 = "";
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_78 = &local_a0;
      local_b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_a8 = "";
      pvVar7 = (iterator)0x1;
      pvVar8 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_70,&local_90,1,0,WARN,(check_type)__s,(size_t)&local_b0,0x1d);
      boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
      local_c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_b8 = "";
      local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x1e;
      file_00.m_begin = (iterator)&local_c0;
      msg_00.m_end = pvVar8;
      msg_00.m_begin = pvVar7;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,
                 msg_00);
      local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)((*ppCVar11)->nHeight < lVar9);
      local_70.m_message.px = (element_type *)0x0;
      local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_a0 = "vIndex[i].pskip->nHeight < i";
      local_98 = "";
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_78 = &local_a0;
      local_e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_d8 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_70,&local_90,1,0,WARN,(check_type)__s,(size_t)&local_e0,0x1e);
    }
    boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
    lVar9 = lVar9 + 1;
    ppCVar11 = ppCVar11 + 0x13;
  } while (lVar9 != 300000);
  this_02 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  this_00 = __s + 299999;
  iVar10 = 0;
  do {
    do {
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        (&this_02->super_RandomMixin<FastRandomContext>,0x13);
    } while (0x493de < uVar4);
    height = (uint)uVar4;
    if (height == 0) {
      uVar2 = 0x20;
    }
    else {
      uVar2 = 0x1f;
      if (height != 0) {
        for (; height >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = uVar2 ^ 0x1f;
    }
    do {
      uVar5 = RandomMixin<FastRandomContext>::randbits
                        (&this_02->super_RandomMixin<FastRandomContext>,0x20 - uVar2);
    } while (uVar4 < uVar5);
    local_120 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_118 = "";
    local_130 = &boost::unit_test::basic_cstring<char_const>::null;
    local_128 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = &DAT_00000028;
    file_02.m_begin = (iterator)&local_120;
    msg_02.m_end = in_R9;
    msg_02.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_130,
               msg_02);
    pCVar6 = CBlockIndex::GetAncestor(this_00,height);
    this_01 = __s + uVar4;
    local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(pCVar6 == this_01);
    local_70.m_message.px = (element_type *)0x0;
    local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a0 = "vIndex[300000 - 1].GetAncestor(from) == &vIndex[from]";
    local_98 = "";
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_a0;
    local_140 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_138 = "";
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_70,&local_90,1,0,WARN,(check_type)__s,(size_t)&local_140,0x28);
    boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
    local_150 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_148 = "";
    local_160 = &boost::unit_test::basic_cstring<char_const>::null;
    local_158 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x29;
    file_03.m_begin = (iterator)&local_150;
    msg_03.m_end = pvVar8;
    msg_03.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_160,
               msg_03);
    pCVar6 = CBlockIndex::GetAncestor(this_01,(int)uVar5);
    local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(pCVar6 == __s + (int)uVar5);
    local_70.m_message.px = (element_type *)0x0;
    local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a0 = "vIndex[from].GetAncestor(to) == &vIndex[to]";
    local_98 = "";
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_a0;
    local_170 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_168 = "";
    pvVar7 = (iterator)0x1;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_70,&local_90,1,0,WARN,(check_type)__s,(size_t)&local_170,0x29);
    boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
    local_180 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_178 = "";
    local_190 = &boost::unit_test::basic_cstring<char_const>::null;
    local_188 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x2a;
    file_04.m_begin = (iterator)&local_180;
    msg_04.m_end = pvVar8;
    msg_04.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_190,
               msg_04);
    pCVar6 = CBlockIndex::GetAncestor(this_01,0);
    local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(pCVar6 == __s);
    local_70.m_message.px = (element_type *)0x0;
    local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a0 = "vIndex[from].GetAncestor(0) == vIndex.data()";
    local_98 = "";
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_a0;
    local_1a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_198 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_70,&local_90,1,0,WARN,(check_type)__s,(size_t)&local_1a0,0x2a);
    boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
    iVar10 = iVar10 + 1;
  } while (iVar10 != 1000);
  operator_delete(__s,45600000);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(skiplist_test)
{
    std::vector<CBlockIndex> vIndex(SKIPLIST_LENGTH);

    for (int i=0; i<SKIPLIST_LENGTH; i++) {
        vIndex[i].nHeight = i;
        vIndex[i].pprev = (i == 0) ? nullptr : &vIndex[i - 1];
        vIndex[i].BuildSkip();
    }

    for (int i=0; i<SKIPLIST_LENGTH; i++) {
        if (i > 0) {
            BOOST_CHECK(vIndex[i].pskip == &vIndex[vIndex[i].pskip->nHeight]);
            BOOST_CHECK(vIndex[i].pskip->nHeight < i);
        } else {
            BOOST_CHECK(vIndex[i].pskip == nullptr);
        }
    }

    for (int i=0; i < 1000; i++) {
        int from = m_rng.randrange(SKIPLIST_LENGTH - 1);
        int to = m_rng.randrange(from + 1);

        BOOST_CHECK(vIndex[SKIPLIST_LENGTH - 1].GetAncestor(from) == &vIndex[from]);
        BOOST_CHECK(vIndex[from].GetAncestor(to) == &vIndex[to]);
        BOOST_CHECK(vIndex[from].GetAncestor(0) == vIndex.data());
    }
}